

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xmlCtxtGetDeclaredEncoding(void)

{
  int iVar1;
  int iVar2;
  xmlParserCtxtPtr val;
  xmlChar *val_00;
  int local_24;
  int n_ctxt;
  xmlParserCtxtPtr ctxt;
  xmlChar *ret_val;
  int mem_base;
  int test_ret;
  
  ret_val._4_4_ = 0;
  for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
    iVar1 = xmlMemBlocks();
    val = gen_xmlParserCtxtPtr(local_24,0);
    val_00 = (xmlChar *)xmlCtxtGetDeclaredEncoding(val);
    desret_const_xmlChar_ptr(val_00);
    call_tests = call_tests + 1;
    des_xmlParserCtxtPtr(local_24,val,0);
    xmlResetLastError();
    iVar2 = xmlMemBlocks();
    if (iVar1 != iVar2) {
      iVar2 = xmlMemBlocks();
      printf("Leak of %d blocks found in xmlCtxtGetDeclaredEncoding",(ulong)(uint)(iVar2 - iVar1));
      ret_val._4_4_ = ret_val._4_4_ + 1;
      printf(" %d");
      printf("\n");
    }
  }
  function_tests = function_tests + 1;
  return ret_val._4_4_;
}

Assistant:

static int
test_xmlCtxtGetDeclaredEncoding(void) {
    int test_ret = 0;

    int mem_base;
    const xmlChar * ret_val;
    xmlParserCtxtPtr ctxt; /* parser context */
    int n_ctxt;

    for (n_ctxt = 0;n_ctxt < gen_nb_xmlParserCtxtPtr;n_ctxt++) {
        mem_base = xmlMemBlocks();
        ctxt = gen_xmlParserCtxtPtr(n_ctxt, 0);

        ret_val = xmlCtxtGetDeclaredEncoding(ctxt);
        desret_const_xmlChar_ptr(ret_val);
        call_tests++;
        des_xmlParserCtxtPtr(n_ctxt, ctxt, 0);
        xmlResetLastError();
        if (mem_base != xmlMemBlocks()) {
            printf("Leak of %d blocks found in xmlCtxtGetDeclaredEncoding",
	           xmlMemBlocks() - mem_base);
	    test_ret++;
            printf(" %d", n_ctxt);
            printf("\n");
        }
    }
    function_tests++;

    return(test_ret);
}